

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O1

int __thiscall
highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
          (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,char *__from,char *__to)

{
  undefined4 *puVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  int extraout_EAX;
  long lVar5;
  LinkType *pLVar6;
  int iVar7;
  ulong *puVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  
  lVar2 = this[2].rootNode[1];
  lVar5 = (long)__from * 0x90;
  puVar8 = (ulong *)(lVar2 + lVar5 + 0x88);
  *puVar8 = (ulong)(__to + 1) | *puVar8 & 0x8000000000000000;
  if (__to == (char *)0xffffffffffffffff) {
    pLVar6 = this->rootNode;
  }
  else {
    lVar9 = (long)__to * 0x90;
    dVar3 = *(double *)(lVar2 + 0x48 + lVar9) * 0.5 + *(double *)(lVar2 + 0x50 + lVar9) * 0.5;
    dVar4 = *(double *)(lVar2 + 0x48 + lVar5) * 0.5 + *(double *)(lVar2 + 0x50 + lVar5) * 0.5;
    uVar10 = 1;
    if (dVar4 <= dVar3) {
      if (dVar3 <= dVar4) {
        iVar11 = (int)((ulong)(*(long *)(lVar2 + 8 + lVar5) - *(long *)(lVar2 + lVar5)) >> 4);
        iVar7 = (int)((ulong)(*(long *)(lVar2 + 8 + lVar9) - *(long *)(lVar2 + lVar9)) >> 4);
        if (iVar7 <= iVar11) {
          uVar10 = (ulong)((long)__to < (long)__from && iVar11 <= iVar7);
        }
      }
      else {
        uVar10 = 0;
      }
    }
    pLVar6 = (LinkType *)(lVar9 + lVar2 + uVar10 * 8 + 0x78);
  }
  *pLVar6 = (LinkType)__from;
  puVar1 = (undefined4 *)(lVar2 + 0x78 + lVar5);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  *puVar8 = *puVar8 | 0x8000000000000000;
  insertFixup(this,(LinkType)__from);
  return extraout_EAX;
}

Assistant:

T getParent() const {
    if (std::is_pointer<T>::value)
      return (T)(parentAndColor & ~colorBitMask());
    else
      return ((T)(parentAndColor & ~colorBitMask())) - 1;
  }